

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void indexedS16_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint16_t *in_RDX;
  m680x_info *in_RSI;
  undefined8 in_RDI;
  m680x_info *unaff_retaddr;
  uint16_t offset;
  uint16_t local_1a;
  uint16_t *local_18;
  
  local_1a = 0;
  local_18 = in_RDX;
  read_word(in_RSI,&local_1a,*in_RDX);
  local_18 = local_18 + 2;
  add_indexed_operand(unaff_retaddr,(m680x_reg)((ulong)in_RDI >> 0x20),
                      SUB81((ulong)in_RDI >> 0x18,0),(uint8_t)((ulong)in_RDI >> 0x10),
                      (uint8_t)((ulong)in_RDI >> 8),(uint16_t)((ulong)in_RSI >> 0x30),
                      SUB81((ulong)in_RSI >> 0x28,0));
  return;
}

Assistant:

static void indexedS16_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint16_t offset = 0;

	read_word(info, &offset, *address);
	address += 2;

	add_indexed_operand(info, M680X_REG_S, false, 0, M680X_OFFSET_BITS_16,
		offset, false);
}